

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O0

saidx64_t * ss_median3(sauchar_t *Td,saidx64_t *PA,saidx64_t *v1,saidx64_t *v2,saidx64_t *v3)

{
  saidx64_t *t;
  saidx64_t *v3_local;
  saidx64_t *v2_local;
  saidx64_t *v1_local;
  saidx64_t *PA_local;
  sauchar_t *Td_local;
  saidx64_t *local_8;
  
  v2_local = v2;
  v1_local = v1;
  if (Td[PA[*v2]] < Td[PA[*v1]]) {
    v2_local = v1;
    v1_local = v2;
  }
  if (Td[PA[*v3]] < Td[PA[*v2_local]]) {
    local_8 = v3;
    if (Td[PA[*v3]] < Td[PA[*v1_local]]) {
      local_8 = v1_local;
    }
  }
  else {
    local_8 = v2_local;
  }
  return local_8;
}

Assistant:

static INLINE
saidx_t *
ss_median3(const sauchar_t *Td, const saidx_t *PA,
           saidx_t *v1, saidx_t *v2, saidx_t *v3) {
  saidx_t *t;
  if(Td[PA[*v1]] > Td[PA[*v2]]) { SWAP(v1, v2); }
  if(Td[PA[*v2]] > Td[PA[*v3]]) {
    if(Td[PA[*v1]] > Td[PA[*v3]]) { return v1; }
    else { return v3; }
  }
  return v2;
}